

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_buffer_sizes.c
# Opt level: O3

int check_block_sizes(test_state *state)

{
  aec_stream *paVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  uVar3 = 8;
  do {
    paVar1 = state->strm;
    paVar1->block_size = uVar3;
    paVar1->rsi = (uint)(state->buf_len / (ulong)((long)(int)uVar3 * (long)state->bytes_per_sample))
    ;
    iVar2 = encode_decode_large(state);
    if (iVar2 != 0) {
      return iVar2;
    }
    bVar4 = uVar3 < 0x21;
    uVar3 = uVar3 * 2;
  } while (bVar4);
  return 0;
}

Assistant:

int check_block_sizes(struct test_state *state)
{
    int bs, status;

    for (bs = 8; bs <= 64; bs *= 2) {
        state->strm->block_size = bs;
        state->strm->rsi = (int)(state->buf_len
                                 / (bs * state->bytes_per_sample));

        status = encode_decode_large(state);
        if (status)
            return status;
    }
    return 0;
}